

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.h
# Opt level: O0

void Abc_SclLoadStore(SC_Man *p,Abc_Obj_t *pObj)

{
  Vec_Flt_t *pVVar1;
  int iVar2;
  Abc_Obj_t *pObj_00;
  SC_Pair *pSVar3;
  int local_24;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj_local;
  SC_Man *p_local;
  
  Vec_FltClear(p->vLoads2);
  for (local_24 = 0; iVar2 = Abc_ObjFaninNum(pObj), local_24 < iVar2; local_24 = local_24 + 1) {
    pObj_00 = Abc_ObjFanin(pObj,local_24);
    pVVar1 = p->vLoads2;
    pSVar3 = Abc_SclObjLoad(p,pObj_00);
    Vec_FltPush(pVVar1,pSVar3->rise);
    pVVar1 = p->vLoads2;
    pSVar3 = Abc_SclObjLoad(p,pObj_00);
    Vec_FltPush(pVVar1,pSVar3->fall);
  }
  return;
}

Assistant:

static inline void Abc_SclLoadStore( SC_Man * p, Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanin;
    int i;
    Vec_FltClear( p->vLoads2 );
    Abc_ObjForEachFanin( pObj, pFanin, i )
    {
        Vec_FltPush( p->vLoads2, Abc_SclObjLoad(p, pFanin)->rise );
        Vec_FltPush( p->vLoads2, Abc_SclObjLoad(p, pFanin)->fall );
    }
}